

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  bool bVar1;
  int *__args;
  pointer pEVar2;
  size_type in_RDX;
  char *in_RSI;
  _Head_base<0UL,_Catch::Detail::EnumInfo_*,_false> in_RDI;
  vector<int,_std::allocator<int>_> *in_R9;
  StringRef in_stack_00000010;
  int value;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t i;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *enumInfo;
  pointer in_stack_ffffffffffffff38;
  EnumInfo *this;
  size_type in_stack_ffffffffffffff68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff70;
  size_type local_80;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_60;
  byte local_31;
  vector<int,_std::allocator<int>_> *local_30;
  char *local_18;
  size_type sStack_10;
  
  local_31 = 0;
  this = in_RDI._M_head_impl;
  local_30 = in_R9;
  local_18 = in_RSI;
  sStack_10 = in_RDX;
  __args = (int *)operator_new(0x28);
  EnumInfo::EnumInfo(in_RDI._M_head_impl);
  std::unique_ptr<Catch::Detail::EnumInfo,std::default_delete<Catch::Detail::EnumInfo>>::
  unique_ptr<std::default_delete<Catch::Detail::EnumInfo>,void>
            ((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *)
             in_RDI._M_head_impl,in_stack_ffffffffffffff38);
  pEVar2 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                       *)0x260a2c);
  (pEVar2->m_name).m_start = local_18;
  (pEVar2->m_name).m_size = sStack_10;
  clara::std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
  operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_> *)
             0x260a41);
  clara::std::vector<int,_std::allocator<int>_>::size(local_30);
  clara::std::
  vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>::
  reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
           *)in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68);
  parseEnums(in_stack_00000010);
  local_80 = 0;
  clara::std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
  clara::std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI._M_head_impl,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff70);
    in_stack_ffffffffffffff38 =
         clara::std::
         unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
         operator->((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                     *)0x260aef);
    in_stack_ffffffffffffff38 = (pointer)&in_stack_ffffffffffffff38->m_values;
    clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::operator[]
              (&local_60,local_80);
    std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
    emplace_back<int&,Catch::StringRef_const&>
              ((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
                *)this,__args,&(in_RDI._M_head_impl)->m_name);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff70);
    local_80 = local_80 + 1;
  }
  local_31 = 1;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)this);
  if ((local_31 & 1) == 0) {
    clara::std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
    ~unique_ptr((unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>
                 *)in_RDI._M_head_impl);
  }
  return (unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>)
         in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            std::unique_ptr<EnumInfo> enumInfo( new EnumInfo );
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }